

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

void Sbd_ManFindCutUnmark_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = *(ulong *)pObj;
  uVar2 = uVar1 >> 0x3e & 1;
  while( true ) {
    if (uVar2 == 0) {
      return;
    }
    *(ulong *)pObj = uVar1 & 0xbfffffffffffffff;
    uVar3 = (uint)uVar1;
    if ((uVar3 >> 0x1e & 1) != 0) break;
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x6d7,"void Sbd_ManFindCutUnmark_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    Sbd_ManFindCutUnmark_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff));
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    uVar1 = *(ulong *)pObj;
    uVar2 = uVar1 & 0x4000000000000000;
  }
  return;
}

Assistant:

void Sbd_ManFindCutUnmark_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !pObj->fMark1 )
        return;
    pObj->fMark1 = 0;
    if ( pObj->fMark0 )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Sbd_ManFindCutUnmark_rec( p, Gia_ObjFanin0(pObj) );
    Sbd_ManFindCutUnmark_rec( p, Gia_ObjFanin1(pObj) );
}